

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor.cc
# Opt level: O2

Result __thiscall wabt::ExprVisitor::VisitExpr(ExprVisitor *this,Expr *root_expr)

{
  pointer *ppSVar1;
  pointer *pppEVar2;
  pointer *ppiVar3;
  pointer pSVar4;
  pointer ppEVar5;
  pointer piVar6;
  Expr *base;
  State state;
  bool bVar7;
  int iVar8;
  Result RVar9;
  BlockExprBase<(wabt::ExprType)26> *pBVar10;
  BlockExprBase<(wabt::ExprType)8> *pBVar11;
  IfExpr *pIVar12;
  TryExpr *pTVar13;
  reference expr;
  iterator *this_00;
  iterator rhs;
  iterator rhs_00;
  iterator rhs_01;
  iterator rhs_02;
  iterator rhs_03;
  iterator rhs_04;
  iterator local_40;
  
  pSVar4 = (this->state_stack_).
           super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->state_stack_).
      super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
      _M_impl.super__Vector_impl_data._M_finish != pSVar4) {
    (this->state_stack_).
    super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar4;
  }
  ppEVar5 = (this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppEVar5) {
    (this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppEVar5;
  }
  piVar6 = (this->expr_iter_stack_).
           super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->expr_iter_stack_).
      super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
      ._M_impl.super__Vector_impl_data._M_finish != piVar6) {
    (this->expr_iter_stack_).
    super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
    ._M_impl.super__Vector_impl_data._M_finish = piVar6;
  }
  PushDefault(this,root_expr);
LAB_0015cd37:
  do {
    pSVar4 = (this->state_stack_).
             super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((this->state_stack_).
        super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
        _M_impl.super__Vector_impl_data._M_start == pSVar4) {
      return (Result)Ok;
    }
  } while (Catch < pSVar4[-1]);
  ppEVar5 = (this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  base = ppEVar5[-1];
  switch(pSVar4[-1]) {
  case Default:
    (this->state_stack_).
    super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar4 + -1;
    (this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppEVar5 + -1;
    RVar9 = HandleDefaultState(this,base);
    goto LAB_0015cd7a;
  case Block:
    pBVar11 = cast<wabt::BlockExprBase<(wabt::ExprType)8>,wabt::Expr>(base);
    this_00 = (this->expr_iter_stack_).
              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1;
    rhs_02.node_ = (Expr *)0x0;
    rhs_02.list_ = &(pBVar11->block).exprs;
    bVar7 = intrusive_list<wabt::Expr>::iterator::operator!=(this_00,rhs_02);
    if (!bVar7) {
      iVar8 = (*this->delegate_->_vptr_Delegate[4])(this->delegate_,pBVar11);
LAB_0015cf7c:
      if (iVar8 == 1) {
        return (Result)Error;
      }
      ppSVar1 = &(this->state_stack_).
                 super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + -1;
      pppEVar2 = &(this->expr_stack_).
                  super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppEVar2 = *pppEVar2 + -1;
      ppiVar3 = &(this->expr_iter_stack_).
                 super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppiVar3 = *ppiVar3 + -1;
      goto LAB_0015cd37;
    }
    break;
  case IfTrue:
    pIVar12 = cast<wabt::IfExpr,wabt::Expr>(base);
    this_00 = (this->expr_iter_stack_).
              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1;
    rhs_00.node_ = (Expr *)0x0;
    rhs_00.list_ = &(pIVar12->true_).exprs;
    bVar7 = intrusive_list<wabt::Expr>::iterator::operator!=(this_00,rhs_00);
    if (!bVar7) {
      iVar8 = (*this->delegate_->_vptr_Delegate[0x12])(this->delegate_,pIVar12);
      if (iVar8 == 1) {
        return (Result)Error;
      }
      ppSVar1 = &(this->state_stack_).
                 super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + -1;
      pppEVar2 = &(this->expr_stack_).
                  super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppEVar2 = *pppEVar2 + -1;
      ppiVar3 = &(this->expr_iter_stack_).
                 super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppiVar3 = *ppiVar3 + -1;
      state = IfFalse;
LAB_0015cf5c:
      PushExprlist(this,state,base,&pIVar12->false_);
      goto LAB_0015cd37;
    }
    break;
  case IfFalse:
    pIVar12 = cast<wabt::IfExpr,wabt::Expr>(base);
    this_00 = (this->expr_iter_stack_).
              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1;
    rhs_01.node_ = (Expr *)0x0;
    rhs_01.list_ = &pIVar12->false_;
    bVar7 = intrusive_list<wabt::Expr>::iterator::operator!=(this_00,rhs_01);
    if (!bVar7) {
      iVar8 = (*this->delegate_->_vptr_Delegate[0x13])(this->delegate_,pIVar12);
      goto LAB_0015cf7c;
    }
    break;
  case Loop:
    pBVar10 = cast<wabt::BlockExprBase<(wabt::ExprType)26>,wabt::Expr>(base);
    this_00 = (this->expr_iter_stack_).
              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1;
    rhs.node_ = (Expr *)0x0;
    rhs.list_ = &(pBVar10->block).exprs;
    bVar7 = intrusive_list<wabt::Expr>::iterator::operator!=(this_00,rhs);
    if (!bVar7) {
      iVar8 = (*this->delegate_->_vptr_Delegate[0x19])(this->delegate_,pBVar10);
      goto LAB_0015cf7c;
    }
    break;
  case Try:
    pIVar12 = (IfExpr *)cast<wabt::TryExpr,wabt::Expr>(base);
    this_00 = (this->expr_iter_stack_).
              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1;
    rhs_03.node_ = (Expr *)0x0;
    rhs_03.list_ = &(pIVar12->true_).exprs;
    bVar7 = intrusive_list<wabt::Expr>::iterator::operator!=(this_00,rhs_03);
    if (bVar7) break;
    iVar8 = (*this->delegate_->_vptr_Delegate[0x34])(this->delegate_,pIVar12);
    if (iVar8 == 1) {
      return (Result)Error;
    }
    ppSVar1 = &(this->state_stack_).
               super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + -1;
    pppEVar2 = &(this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppEVar2 = *pppEVar2 + -1;
    ppiVar3 = &(this->expr_iter_stack_).
               super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppiVar3 = *ppiVar3 + -1;
    if ((pIVar12->false_).size_ != 0) {
      state = Catch;
      goto LAB_0015cf5c;
    }
    RVar9.enum_ = (*this->delegate_->_vptr_Delegate[0x35])(this->delegate_,pIVar12);
LAB_0015cd7a:
    if (RVar9.enum_ == Error) {
      return (Result)Error;
    }
    goto LAB_0015cd37;
  case Catch:
    pTVar13 = cast<wabt::TryExpr,wabt::Expr>(base);
    this_00 = (this->expr_iter_stack_).
              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1;
    rhs_04.node_ = (Expr *)0x0;
    rhs_04.list_ = &pTVar13->catch_;
    bVar7 = intrusive_list<wabt::Expr>::iterator::operator!=(this_00,rhs_04);
    if (!bVar7) {
      iVar8 = (*this->delegate_->_vptr_Delegate[0x35])(this->delegate_,pTVar13);
      goto LAB_0015cf7c;
    }
  }
  local_40 = intrusive_list<wabt::Expr>::iterator::operator++(this_00,0);
  expr = intrusive_list<wabt::Expr>::iterator::operator*(&local_40);
  PushDefault(this,expr);
  goto LAB_0015cd37;
}

Assistant:

Result ExprVisitor::VisitExpr(Expr* root_expr) {
  state_stack_.clear();
  expr_stack_.clear();
  expr_iter_stack_.clear();

  PushDefault(root_expr);

  while (!state_stack_.empty()) {
    State state = state_stack_.back();
    auto* expr = expr_stack_.back();

    switch (state) {
      case State::Default:
        PopDefault();
        CHECK_RESULT(HandleDefaultState(expr));
        break;

      case State::Block: {
        auto block_expr = cast<BlockExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != block_expr->block.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->EndBlockExpr(block_expr));
          PopExprlist();
        }
        break;
      }

      case State::IfTrue: {
        auto if_expr = cast<IfExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != if_expr->true_.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->AfterIfTrueExpr(if_expr));
          PopExprlist();
          PushExprlist(State::IfFalse, expr, if_expr->false_);
        }
        break;
      }

      case State::IfFalse: {
        auto if_expr = cast<IfExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != if_expr->false_.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->EndIfExpr(if_expr));
          PopExprlist();
        }
        break;
      }

      case State::Loop: {
        auto loop_expr = cast<LoopExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != loop_expr->block.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->EndLoopExpr(loop_expr));
          PopExprlist();
        }
        break;
      }

      case State::Try: {
        auto try_expr = cast<TryExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != try_expr->block.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->OnCatchExpr(try_expr));
          PopExprlist();
          if (try_expr->catch_.empty()) {
            CHECK_RESULT(delegate_->EndTryExpr(try_expr));
          } else {
            PushExprlist(State::Catch, expr, try_expr->catch_);
          }
        }
        break;
      }

      case State::Catch: {
        auto try_expr = cast<TryExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != try_expr->catch_.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->EndTryExpr(try_expr));
          PopExprlist();
        }
        break;
      }
    }
  }

  return Result::Ok;
}